

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int UnixVfs_Chgrp(char *zPath,char *zGroup)

{
  int iVar1;
  group *pgVar2;
  
  pgVar2 = getgrnam(zGroup);
  if (pgVar2 == (group *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = chown(zPath,0xffffffff,pgVar2->gr_gid);
    iVar1 = -(uint)(iVar1 != 0);
  }
  return iVar1;
}

Assistant:

static int UnixVfs_Chgrp(const char *zPath, const char *zGroup)
{
#ifndef JX9_UNIX_STATIC_BUILD
  struct group *group;
  gid_t gid;
  int rc;
  group = getgrnam(zGroup);
  if (group == 0) {
    return -1;
  }
  gid = group->gr_gid;
  rc = chown(zPath, -1, gid);
  return rc == 0 ? JX9_OK : -1;
#else
	SXUNUSED(zPath);
	SXUNUSED(zGroup);
	return -1;
#endif /* JX9_UNIX_STATIC_BUILD */
}